

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

void __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>::
FreeHeapBlock(HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_> *this
             ,SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *heapBlock)

{
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *heapBlock_local;
  HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_> *this_local;
  
  SmallHeapBlockT<SmallAllocationBlockAttributes>::Reset
            ((SmallHeapBlockT<SmallAllocationBlockAttributes> *)heapBlock);
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::SetNextBlock
            (heapBlock,this->emptyBlockList);
  this->emptyBlockList = heapBlock;
  (this->super_HeapBucket).emptyHeapBlockCount = (this->super_HeapBucket).emptyHeapBlockCount + 1;
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::FreeHeapBlock(TBlockType * heapBlock)
{
    heapBlock->Reset();
    heapBlock->SetNextBlock(emptyBlockList);
    emptyBlockList = heapBlock;
#if defined(RECYCLER_SLOW_CHECK_ENABLED)
    this->emptyHeapBlockCount++;
#endif
}